

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

Abc_Cex_t * Bmcs_ManGenerateCex(Bmcs_Man_t *p,int i,int f,int s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Cex_t *pAVar5;
  bool bVar6;
  int iFrame;
  int iCiId;
  int iSatVar;
  int k;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pCex;
  int s_local;
  int f_local;
  int i_local;
  Bmcs_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p->pGia);
  iVar2 = Gia_ManPiNum(p->pGia);
  iVar3 = Gia_ManPoNum(p->pGia);
  iVar4 = Gia_ManPoNum(p->pGia);
  pAVar5 = Abc_CexMakeTriv(iVar1,iVar2,iVar3,f * iVar4 + i);
  iCiId = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p->pFrames);
    bVar6 = false;
    if (iCiId < iVar1) {
      _iSatVar = Gia_ManCi(p->pFrames,iCiId);
      bVar6 = _iSatVar != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjId(p->pFrames,_iSatVar);
    iVar1 = Vec_IntEntry(&p->vFr2Sat,iVar1);
    if (0 < iVar1) {
      iVar1 = satoko_read_cex_varvalue(p->pSats[s],iVar1);
      if (iVar1 != 0) {
        iVar1 = Vec_IntEntry(&p->vCiMap,iCiId << 1);
        iVar2 = Vec_IntEntry(&p->vCiMap,iCiId * 2 + 1);
        iVar3 = Gia_ManRegNum(p->pGia);
        iVar4 = Gia_ManPiNum(p->pGia);
        Abc_InfoSetBit((uint *)(pAVar5 + 1),iVar3 + iVar2 * iVar4 + iVar1);
      }
    }
    iCiId = iCiId + 1;
  }
  return pAVar5;
}

Assistant:

Abc_Cex_t * Bmcs_ManGenerateCex( Bmcs_Man_t * p, int i, int f, int s )
{
    Abc_Cex_t * pCex = Abc_CexMakeTriv( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), Gia_ManPoNum(p->pGia), f*Gia_ManPoNum(p->pGia)+i );
    Gia_Obj_t * pObj;  int k;
    Gia_ManForEachPi( p->pFrames, pObj, k )
    {
        int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
        if ( iSatVar > 0 && bmc_sat_solver_read_cex_varvalue(p->pSats[s], iSatVar) ) // 1 bit
        {
            int iCiId   = Vec_IntEntry( &p->vCiMap, 2*k+0 );
            int iFrame  = Vec_IntEntry( &p->vCiMap, 2*k+1 );
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p->pGia) + iFrame * Gia_ManPiNum(p->pGia) + iCiId );
        }
    }
    return pCex;
}